

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editor.c
# Opt level: O2

_Bool golf_editor_edit_entities_compare
                (golf_edit_mode_entity_t entity0,golf_edit_mode_entity_t entity1)

{
  int iVar1;
  golf_edit_mode_entity_type_t gVar2;
  int iVar3;
  
  gVar2 = entity0.type;
  if (gVar2 != entity1.type) {
    return false;
  }
  iVar1 = entity1.idx;
  iVar3 = entity0.idx;
  if (gVar2 != GOLF_EDIT_MODE_ENTITY_POINT) {
    if (gVar2 == GOLF_EDIT_MODE_ENTITY_LINE) {
      if (iVar3 == iVar1 && entity0.idx2 == entity1.idx2) {
        return true;
      }
      return iVar1 == entity0.idx2 && iVar3 == entity1.idx2;
    }
    if (gVar2 != GOLF_EDIT_MODE_ENTITY_FACE) {
      return false;
    }
  }
  return iVar3 == iVar1;
}

Assistant:

bool golf_editor_edit_entities_compare(golf_edit_mode_entity_t entity0, golf_edit_mode_entity_t entity1) {
    if (entity0.type != entity1.type) {
        return false;
    }
    switch (entity0.type) {
        case GOLF_EDIT_MODE_ENTITY_FACE:
        case GOLF_EDIT_MODE_ENTITY_POINT:
            return entity0.idx == entity1.idx;
            break;
        case GOLF_EDIT_MODE_ENTITY_LINE:
            return (entity0.idx == entity1.idx && entity0.idx2 == entity1.idx2) ||
                (entity0.idx == entity1.idx2 && entity0.idx2 == entity1.idx);
            break;
    }
    return false;
}